

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O1

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig> *this)

{
  Context *pCVar1;
  Function p_Var2;
  TestConfig_conflict TVar3;
  VkDeviceSize VVar4;
  undefined8 uVar5;
  VkDeviceSize VVar6;
  VkDeviceSize VVar7;
  pointer in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffb0;
  pointer in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd9;
  
  pCVar1 = (this->super_TestInstance).m_context;
  p_Var2 = (this->m_args).func;
  VVar6 = (this->m_args).arg0.mapping.offset;
  VVar7 = (this->m_args).arg0.mapping.size;
  VVar4 = (this->m_args).arg0.allocationSize;
  uVar5 = *(undefined8 *)&(this->m_args).arg0.seed;
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
            *)&stack0xffffffffffffffa8,&(this->m_args).arg0.flushMappings);
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
            *)&stack0xffffffffffffffc0,&(this->m_args).arg0.invalidateMappings);
  TVar3._8_8_ = uVar5;
  TVar3.allocationSize = VVar4;
  TVar3.mapping.offset = VVar6;
  TVar3.mapping.size = VVar7;
  TVar3.flushMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start = in_stack_ffffffffffffffa8;
  TVar3.flushMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = in_stack_ffffffffffffffb0;
  TVar3.flushMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffb8;
  TVar3.invalidateMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start = in_stack_ffffffffffffffc0;
  TVar3.invalidateMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = in_stack_ffffffffffffffc8;
  TVar3.invalidateMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffd0;
  TVar3.remap = (this->m_args).arg0.remap;
  TVar3._81_7_ = in_stack_ffffffffffffffd9;
  (*p_Var2)(__return_storage_ptr__,pCVar1,TVar3);
  if (in_stack_ffffffffffffffc0 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffffc0,
                    (long)in_stack_ffffffffffffffd0 - (long)in_stack_ffffffffffffffc0);
  }
  if (in_stack_ffffffffffffffa8 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffffa8,
                    (long)in_stack_ffffffffffffffb8 - (long)in_stack_ffffffffffffffa8);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }